

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O2

uint64_t __thiscall binlog::Session::addEventSource(Session *this,EventSource *eventSource)

{
  uint64_t uVar1;
  
  std::mutex::lock(&this->_mutex);
  eventSource->id = this->_nextSourceId;
  serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
            (eventSource,&this->_sources);
  uVar1 = this->_nextSourceId;
  this->_nextSourceId = uVar1 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return uVar1;
}

Assistant:

inline std::uint64_t Session::addEventSource(EventSource eventSource)
{
  std::lock_guard<std::mutex> lock(_mutex);

  eventSource.id = _nextSourceId;
  serializeSizePrefixedTagged(eventSource, _sources);
  return _nextSourceId++;
}